

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

gc_heap_ptr<mjs::number_object> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>const&,double&>
          (gc_heap *this,size_t num_bytes,string *args,gc_heap_ptr<mjs::object> *args_1,
          double *args_2)

{
  slot *p;
  undefined8 extraout_RDX;
  double *in_R9;
  allocation_result aVar1;
  gc_heap_ptr<mjs::number_object> gVar2;
  
  aVar1 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  p = aVar1.obj;
  if (*(int *)((long)p + -4) == -1) {
    gc_type_info_registration<mjs::number_object>::
    construct<mjs::string,mjs::gc_heap_ptr<mjs::object>const&,double&>
              (p,(string *)args_1,(gc_heap_ptr<mjs::object> *)args_2,in_R9);
    *(undefined4 *)((long)p + -4) = gc_type_info_registration<mjs::number_object>::reg._40_4_;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)this,(gc_heap *)num_bytes,aVar1.pos);
    gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar2.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::number_object>)gVar2.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::number_object, Args = <mjs::string, const mjs::gc_heap_ptr<mjs::object> &, double &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}